

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QPluginParsedMetaData*>,long_long>
               (reverse_iterator<QPluginParsedMetaData_*> first,longlong n,
               reverse_iterator<QPluginParsedMetaData_*> d_first)

{
  undefined4 uVar1;
  QCborValue *pQVar2;
  long lVar3;
  undefined8 uVar4;
  QCborValue *pQVar5;
  QCborValue *pQVar6;
  reverse_iterator<QPluginParsedMetaData_*> *prVar7;
  QCborValue *pQVar8;
  long in_FS_OFFSET;
  Destructor local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  local_48.end.current = (QPluginParsedMetaData *)((d_first.current)->data).n;
  pQVar5 = (QCborValue *)(local_48.end.current + -n);
  pQVar2 = (QCborValue *)((first.current)->data).n;
  pQVar8 = pQVar2;
  pQVar6 = pQVar5;
  if (pQVar5 < pQVar2) {
    pQVar8 = pQVar5;
    pQVar6 = pQVar2;
  }
  while (pQVar2 = (QCborValue *)((d_first.current)->data).n, pQVar2 != pQVar6) {
    lVar3 = ((first.current)->data).n;
    *(undefined8 *)(pQVar2 + -0x18) = *(undefined8 *)(lVar3 + -0x18);
    uVar4 = *(undefined8 *)(lVar3 + -0x10);
    *(undefined8 *)(lVar3 + -0x10) = 0;
    *(undefined8 *)(pQVar2 + -0x10) = uVar4;
    uVar1 = *(undefined4 *)(lVar3 + -8);
    *(undefined4 *)(lVar3 + -8) = 0x117;
    *(undefined4 *)(pQVar2 + -8) = uVar1;
    ((d_first.current)->data).n = ((d_first.current)->data).n + -0x18;
    ((first.current)->data).n = ((first.current)->data).n + -0x18;
  }
  local_48.intermediate.current = (QPluginParsedMetaData *)((d_first.current)->data).n;
  while (pQVar2 = (QCborValue *)((d_first.current)->data).n, prVar7 = &local_48.end,
        pQVar2 != pQVar5) {
    QCborValue::operator=(pQVar2 + -0x18,(QCborValue *)(((first.current)->data).n + -0x18));
    ((d_first.current)->data).n = ((d_first.current)->data).n + -0x18;
    ((first.current)->data).n = ((first.current)->data).n + -0x18;
  }
  while (local_48.iter = prVar7, pQVar5 = (QCborValue *)((first.current)->data).n, pQVar5 != pQVar8)
  {
    ((first.current)->data).n = (qint64)(pQVar5 + 0x18);
    QCborValue::~QCborValue(pQVar5);
    prVar7 = local_48.iter;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QPluginParsedMetaData_*>,_long_long>::
  Destructor::~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}